

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.cpp
# Opt level: O2

shared_ptr<apache::thrift::TProcessor> __thiscall
jaegertracing::thrift::AggregationValidatorProcessorFactory::getProcessor
          (AggregationValidatorProcessorFactory *this,TConnectionInfo *connInfo)

{
  AggregationValidatorIf *__p;
  AggregationValidatorProcessor *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<apache::thrift::TProcessor> sVar1;
  shared_ptr<jaegertracing::thrift::AggregationValidatorIf> handler;
  ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory> cleanup;
  __shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<jaegertracing::thrift::AggregationValidatorIfFactory,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  
  std::
  __shared_ptr<jaegertracing::thrift::AggregationValidatorIfFactory,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<jaegertracing::thrift::AggregationValidatorIfFactory,_(__gnu_cxx::_Lock_policy)2>
                *)&cleanup,
               (__shared_ptr<jaegertracing::thrift::AggregationValidatorIfFactory,_(__gnu_cxx::_Lock_policy)2>
                *)(connInfo + 8));
  __p = (AggregationValidatorIf *)(**(code **)(**(long **)(connInfo + 8) + 0x10))();
  std::
  __shared_ptr<jaegertracing::thrift::AggregationValidatorIfFactory,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_30,
               (__shared_ptr<jaegertracing::thrift::AggregationValidatorIfFactory,_(__gnu_cxx::_Lock_policy)2>
                *)&cleanup);
  std::shared_ptr<jaegertracing::thrift::AggregationValidatorIf>::
  shared_ptr<jaegertracing::thrift::AggregationValidatorIf,apache::thrift::ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory>,void>
            (&handler,__p,
             (ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  this_00 = (AggregationValidatorProcessor *)operator_new(0x58);
  std::__shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_40,
               &handler.
                super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
              );
  AggregationValidatorProcessor::AggregationValidatorProcessor
            (this_00,(shared_ptr<jaegertracing::thrift::AggregationValidatorIf> *)&local_40);
  std::__shared_ptr<apache::thrift::TProcessor,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<jaegertracing::thrift::AggregationValidatorProcessor,void>
            ((__shared_ptr<apache::thrift::TProcessor,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&handler.
              super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cleanup.handlerFactory_.
              super___shared_ptr<jaegertracing::thrift::AggregationValidatorIfFactory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  sVar1.super___shared_ptr<apache::thrift::TProcessor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<apache::thrift::TProcessor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<apache::thrift::TProcessor>)
         sVar1.super___shared_ptr<apache::thrift::TProcessor,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

::apache::thrift::stdcxx::shared_ptr< ::apache::thrift::TProcessor > AggregationValidatorProcessorFactory::getProcessor(const ::apache::thrift::TConnectionInfo& connInfo) {
  ::apache::thrift::ReleaseHandler< AggregationValidatorIfFactory > cleanup(handlerFactory_);
  ::apache::thrift::stdcxx::shared_ptr< AggregationValidatorIf > handler(handlerFactory_->getHandler(connInfo), cleanup);
  ::apache::thrift::stdcxx::shared_ptr< ::apache::thrift::TProcessor > processor(new AggregationValidatorProcessor(handler));
  return processor;
}